

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

vector<gpu::Device,_std::allocator<gpu::Device>_> *
gpu::selectDevices(vector<gpu::Device,_std::allocator<gpu::Device>_> *__return_storage_ptr__,
                  uint mask,bool silent)

{
  bool bVar1;
  Device *pDVar2;
  reference this;
  Device *device;
  size_t k;
  undefined1 local_30 [8];
  vector<gpu::Device,_std::allocator<gpu::Device>_> devices;
  bool silent_local;
  uint mask_local;
  vector<gpu::Device,_std::allocator<gpu::Device>_> *res;
  
  devices.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = silent;
  devices.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = mask;
  if (mask == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<gpu::Device,_std::allocator<gpu::Device>_>::vector(__return_storage_ptr__);
  }
  else {
    enumDevices();
    std::vector<gpu::Device,_std::allocator<gpu::Device>_>::vector(__return_storage_ptr__);
    for (device = (Device *)0x0;
        pDVar2 = (Device *)
                 std::vector<gpu::Device,_std::allocator<gpu::Device>_>::size
                           ((vector<gpu::Device,_std::allocator<gpu::Device>_> *)local_30),
        device < pDVar2; device = (Device *)&(device->name).field_0x1) {
      if (((devices.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ & 1 << ((byte)device & 0x1f)) != 0) &&
         ((this = std::vector<gpu::Device,_std::allocator<gpu::Device>_>::operator[]
                            ((vector<gpu::Device,_std::allocator<gpu::Device>_> *)local_30,
                             (size_type)device),
          (devices.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0 ||
          (bVar1 = Device::printInfo(this), bVar1)))) {
        std::vector<gpu::Device,_std::allocator<gpu::Device>_>::push_back
                  (__return_storage_ptr__,this);
      }
    }
    std::vector<gpu::Device,_std::allocator<gpu::Device>_>::~vector
              ((vector<gpu::Device,_std::allocator<gpu::Device>_> *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Device> selectDevices(unsigned int mask, bool silent)
{
	if (!mask)
		return std::vector<Device>();

	std::vector<Device> devices = enumDevices();

	std::vector<Device> res;
	for (size_t k = 0; k < devices.size(); k++) {
		if (!(mask & (1 << k)))
			continue;

		Device &device = devices[k];
		if (!silent)
			if (!device.printInfo())
				continue;

		res.push_back(device);
	}

	return res;
}